

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O1

void gen_stvewx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGContext_conflict10 *tcg_ctx_01;
  uint uVar1;
  TCGTemp *pTVar2;
  TCGv_i64 arg;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o_1;
  uintptr_t o;
  TCGv_i64 ret;
  TCGTemp *local_38;
  TCGTemp *local_30;
  TCGTemp *local_28;
  
  if (ctx->altivec_enabled == false) {
    gen_exception(ctx,0x49);
    return;
  }
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),0x20
                     );
    ctx->access_type = 0x20;
  }
  pTVar2 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar2 - (long)tcg_ctx_00);
  tcg_ctx_01 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode >> 0x10 & 0x1f;
  arg = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
  if (uVar1 == 0) {
    if (ctx->sf_mode != false) {
      if (arg != ret) {
        tcg_gen_op2_ppc64(tcg_ctx_01,INDEX_op_mov_i64,(TCGArg)((long)tcg_ctx_01 + (long)ret),
                          (TCGArg)(arg + (long)tcg_ctx_01));
      }
      goto LAB_00baf96c;
    }
  }
  else {
    tcg_gen_op3_ppc64(tcg_ctx_01,INDEX_op_add_i64,(TCGArg)((long)tcg_ctx_01 + (long)ret),
                      (TCGArg)((long)&tcg_ctx_01->pool_cur + (long)cpu_gpr[uVar1]),
                      (TCGArg)(arg + (long)tcg_ctx_01));
    arg = ret;
    if (ctx->sf_mode != false) goto LAB_00baf96c;
  }
  tcg_gen_ext32u_i64_ppc64(tcg_ctx_01,ret,arg);
LAB_00baf96c:
  tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret,ret,-4);
  uVar1 = ctx->opcode;
  pTVar2 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  tcg_gen_addi_i64_ppc64
            (tcg_ctx_00,(TCGv_i64)((long)pTVar2 - (long)tcg_ctx_00),(TCGv_i64)tcg_ctx_00->cpu_env,
             (ulong)(uVar1 >> 0x11 & 0x1f0) + 0x12d20);
  local_38 = (TCGTemp *)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00);
  local_30 = pTVar2;
  local_28 = (TCGTemp *)(ret + (long)tcg_ctx_00);
  tcg_gen_callN_ppc64(tcg_ctx_00,helper_stvewx_ppc64,(TCGTemp *)0x0,3,&local_38);
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(ret + (long)tcg_ctx_00));
  tcg_temp_free_internal_ppc64(tcg_ctx_00,pTVar2);
  return;
}

Assistant:

static void gen_mfvscr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t;
    TCGv_i64 avr;
    if (unlikely(!ctx->altivec_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VPU);
        return;
    }
    avr = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_movi_i64(tcg_ctx, avr, 0);
    set_avr64(tcg_ctx, rD(ctx->opcode), avr, true);
    t = tcg_temp_new_i32(tcg_ctx);
    gen_helper_mfvscr(tcg_ctx, t, tcg_ctx->cpu_env);
    tcg_gen_extu_i32_i64(tcg_ctx, avr, t);
    set_avr64(tcg_ctx, rD(ctx->opcode), avr, false);
    tcg_temp_free_i32(tcg_ctx, t);
    tcg_temp_free_i64(tcg_ctx, avr);
}